

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O1

void Gia_ManTerStateInsert(uint *pState,int nWords,uint **pBins,int nBins)

{
  uint *puVar1;
  ulong uVar2;
  uint uVar3;
  
  if (nWords < 1) {
    uVar3 = 0;
  }
  else {
    uVar2 = 0;
    uVar3 = 0;
    do {
      uVar3 = uVar3 ^ Gia_ManTerStateHash::s_FPrimes[(uint)uVar2 & 0x7f] * pState[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)nWords != uVar2);
  }
  puVar1 = Gia_ManTerStateLookup(pState,nWords,pBins,nBins);
  if (puVar1 != (uint *)0x0) {
    __assert_fail("!Gia_ManTerStateLookup( pState, nWords, pBins, nBins )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTsim.c"
                  ,0x13a,"void Gia_ManTerStateInsert(unsigned int *, int, unsigned int **, int)");
  }
  *(uint **)(pState + nWords) = pBins[(int)(uVar3 % (uint)nBins)];
  pBins[(int)(uVar3 % (uint)nBins)] = pState;
  return;
}

Assistant:

void Gia_ManTerStateInsert( unsigned * pState, int nWords, unsigned ** pBins, int nBins )
{
    int Hash = Gia_ManTerStateHash( pState, nWords, nBins );
    assert( !Gia_ManTerStateLookup( pState, nWords, pBins, nBins ) );
    Gia_ManTerStateSetNext( pState, nWords, pBins[Hash] );
    pBins[Hash] = pState;    
}